

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<QOpenGLProgramBinaryCache::ShaderDesc*,long_long>
               (ShaderDesc *first,longlong n,ShaderDesc *d_first)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  ShaderDesc *pSVar4;
  ShaderDesc *pSVar5;
  ShaderDesc *pSVar6;
  long in_FS_OFFSET;
  Destructor local_38;
  ShaderDesc *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar5 = d_first + n;
  pSVar6 = first;
  pSVar4 = pSVar5;
  if (first < pSVar5) {
    pSVar6 = pSVar5;
    pSVar4 = first;
  }
  local_20 = d_first;
  if (d_first != pSVar4) {
    do {
      local_20->stage = first->stage;
      pDVar1 = (first->source).d.d;
      (first->source).d.d = (Data *)0x0;
      (local_20->source).d.d = pDVar1;
      pcVar2 = (first->source).d.ptr;
      (first->source).d.ptr = (char *)0x0;
      (local_20->source).d.ptr = pcVar2;
      qVar3 = (first->source).d.size;
      (first->source).d.size = 0;
      (local_20->source).d.size = qVar3;
      local_20 = local_20 + 1;
      first = first + 1;
    } while (local_20 != pSVar4);
  }
  local_38.iter = &local_38.end;
  for (pSVar4 = local_20; local_38.end = d_first, local_38.intermediate = local_20, pSVar4 != pSVar5
      ; pSVar4 = pSVar4 + 1) {
    pSVar4->stage = first->stage;
    pDVar1 = (pSVar4->source).d.d;
    (pSVar4->source).d.d = (first->source).d.d;
    (first->source).d.d = pDVar1;
    pcVar2 = (pSVar4->source).d.ptr;
    (pSVar4->source).d.ptr = (first->source).d.ptr;
    (first->source).d.ptr = pcVar2;
    qVar3 = (pSVar4->source).d.size;
    (pSVar4->source).d.size = (first->source).d.size;
    (first->source).d.size = qVar3;
    first = first + 1;
  }
  for (; local_20 = pSVar4, first != pSVar6; first = first + -1) {
    pDVar1 = first[-1].source.d.d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].source.d.d)->super_QArrayData,1,0x10);
      }
    }
    pSVar4 = local_20;
  }
  q_relocate_overlap_n_left_move<QOpenGLProgramBinaryCache::ShaderDesc_*,_long_long>::Destructor::
  ~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}